

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventpoint.cpp
# Opt level: O0

void QMutableEventPoint::detach(QEventPoint *p)

{
  bool bVar1;
  void *pvVar2;
  QEventPointPrivate *in_RDI;
  QExplicitlySharedDataPointer<QEventPointPrivate> *unaff_retaddr;
  QEventPointPrivate *in_stack_00000018;
  QExplicitlySharedDataPointer<QEventPointPrivate> *in_stack_fffffffffffffff0;
  QEventPointPrivate *this;
  
  bVar1 = ::QExplicitlySharedDataPointer::operator_cast_to_bool
                    ((QExplicitlySharedDataPointer<QEventPointPrivate> *)0x3446c7);
  if (bVar1) {
    QExplicitlySharedDataPointer<QEventPointPrivate>::detach(in_stack_fffffffffffffff0);
  }
  else {
    this = in_RDI;
    pvVar2 = operator_new(0xe0);
    QEventPointPrivate::QEventPointPrivate
              (this,(int)((ulong)pvVar2 >> 0x20),(QPointingDevice *)in_RDI);
    QExplicitlySharedDataPointer<QEventPointPrivate>::reset(unaff_retaddr,in_stack_00000018);
  }
  return;
}

Assistant:

void QMutableEventPoint::detach(QEventPoint &p)
{
    if (p.d)
        p.d.detach();
    else
        p.d.reset(new QEventPointPrivate(-1, nullptr));
}